

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O3

void __thiscall z80::z80(z80 *this,OpCode o,Operand *o1,Operand *o2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 in_register_00000034;
  string local_50;
  
  to_string_abi_cxx11_(&local_50,(z80 *)CONCAT44(in_register_00000034,o),(OpCode)o1);
  (this->super_ASMLine).type = Instruction;
  paVar1 = &(this->super_ASMLine).text.field_2;
  (this->super_ASMLine).text._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    *(undefined4 *)paVar1 = local_50.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(this->super_ASMLine).text.field_2 + 4) =
         local_50.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(this->super_ASMLine).text.field_2 + 8) = local_50.field_2._8_4_;
    *(undefined4 *)((long)&(this->super_ASMLine).text.field_2 + 0xc) = local_50.field_2._12_4_;
  }
  else {
    (this->super_ASMLine).text._M_dataplus._M_p = local_50._M_dataplus._M_p;
    (this->super_ASMLine).text.field_2._M_allocated_capacity =
         CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                  local_50.field_2._M_allocated_capacity._0_4_);
  }
  (this->super_ASMLine).text._M_string_length = local_50._M_string_length;
  local_50._M_string_length = 0;
  local_50.field_2._M_allocated_capacity._0_4_ =
       local_50.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  this->opcode = o;
  iVar3 = o1->reg_num;
  (this->op1).type = o1->type;
  (this->op1).reg_num = iVar3;
  (this->op1).value._M_dataplus._M_p = (pointer)&(this->op1).value.field_2;
  pcVar2 = (o1->value)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->op1).value,pcVar2,pcVar2 + (o1->value)._M_string_length);
  iVar3 = o2->reg_num;
  (this->op2).type = o2->type;
  (this->op2).reg_num = iVar3;
  (this->op2).value._M_dataplus._M_p = (pointer)&(this->op2).value.field_2;
  pcVar2 = (o2->value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->op2).value,pcVar2,pcVar2 + (o2->value)._M_string_length);
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  (this->comment)._M_string_length = 0;
  (this->comment).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

z80(const OpCode o, const Operand o1, const Operand o2)
	: ASMLine(Type::Instruction, to_string(o))
		, opcode(o), op1(o1), op2(o2)
	{}